

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qetag.c
# Opt level: O0

Qiniu_Error Qiniu_Qetag_DigestBuffer(char *buf,size_t bufSize,char **digest)

{
  Qiniu_Error QVar1;
  undefined4 uStack_64;
  undefined4 uStack_54;
  undefined4 uStack_44;
  _Qiniu_Qetag_Context *local_38;
  _Qiniu_Qetag_Context *ctx;
  char **digest_local;
  size_t bufSize_local;
  char *buf_local;
  Qiniu_Error err;
  
  local_38 = (_Qiniu_Qetag_Context *)0x0;
  ctx = (_Qiniu_Qetag_Context *)digest;
  digest_local = (char **)bufSize;
  bufSize_local = (size_t)buf;
  QVar1 = Qiniu_Qetag_New(&local_38,(uint)bufSize);
  err._0_8_ = QVar1.message;
  buf_local = (char *)CONCAT44(uStack_44,QVar1.code);
  if (QVar1.code == 200) {
    QVar1 = Qiniu_Qetag_Update(local_38,(char *)bufSize_local,(size_t)digest_local);
    err._0_8_ = QVar1.message;
    buf_local = (char *)CONCAT44(uStack_54,QVar1.code);
    if (QVar1.code == 200) {
      QVar1 = Qiniu_Qetag_Final(local_38,(char **)ctx);
      err._0_8_ = QVar1.message;
      buf_local = (char *)CONCAT44(uStack_64,QVar1.code);
      Qiniu_Qetag_Destroy(local_38);
    }
    else {
      Qiniu_Qetag_Destroy(local_38);
    }
  }
  QVar1._0_8_ = (ulong)buf_local & 0xffffffff;
  QVar1.message = (char *)err._0_8_;
  return QVar1;
}

Assistant:

Qiniu_Error Qiniu_Qetag_DigestBuffer(const char * buf, size_t bufSize, char ** digest)
{
    Qiniu_Error err;
    struct _Qiniu_Qetag_Context * ctx = NULL;

    err = Qiniu_Qetag_New(&ctx, bufSize);
    if (err.code != 200) {
        return err;
    }

    err = Qiniu_Qetag_Update(ctx, buf, bufSize);
    if (err.code != 200) {
        Qiniu_Qetag_Destroy(ctx);
        return err;
    }

    err = Qiniu_Qetag_Final(ctx, digest);
    Qiniu_Qetag_Destroy(ctx);
    return err;
}